

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca.cpp
# Opt level: O1

void dfs(int a)

{
  int a_00;
  int *piVar1;
  int *piVar2;
  
  piVar2 = g[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = g[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar2 != piVar1) {
    do {
      a_00 = *piVar2;
      if (a_00 != pred[a][0]) {
        d[a_00] = d[a] + 1;
        pred[a_00][0] = a;
        dfs(a_00);
      }
      piVar2 = piVar2 + 1;
    } while (piVar2 != piVar1);
  }
  return;
}

Assistant:

void dfs(int a) {
    for (auto b : g[a]) {
        if (b == pred[a][0]) continue;
        d[b] = d[a] + 1;
        pred[b][0] = a;
        dfs(b);
    }
}